

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,PixelFormat format)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "Float";
    pcVar1 = "";
  }
  else if (iVar2 == 1) {
    pcVar3 = "Half";
    pcVar1 = "";
  }
  else {
    if (iVar2 != 0) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x35,"Unhandled PixelFormat in FormatName()");
    }
    pcVar3 = "U256";
    pcVar1 = "";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(PixelFormat format) {
    switch (format) {
    case PixelFormat::U256:
        return "U256";
    case PixelFormat::Half:
        return "Half";
    case PixelFormat::Float:
        return "Float";
    default:
        LOG_FATAL("Unhandled PixelFormat in FormatName()");
        return "";
    }
}